

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  char *pcVar9;
  char *text;
  ImFontGlyph *pIVar10;
  int iVar11;
  ImDrawIdx IVar12;
  float scale;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float local_bc;
  float local_b8;
  undefined1 local_a8 [16];
  uint c;
  ulong local_90;
  ImDrawIdx *local_88;
  ImDrawVert *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  char *local_50;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  if (text_end == (char *)0x0) {
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
  }
  fVar13 = (float)(int)pos->y;
  local_a8 = ZEXT416((uint)fVar13);
  if (fVar13 < clip_rect->w || fVar13 == clip_rect->w) {
    _local_48 = ZEXT416((uint)pos->x);
    scale = size / this->FontSize;
    fVar14 = this->FontSize * scale;
    local_b8 = clip_rect->y;
    if (fVar13 + fVar14 < local_b8) {
      while( true ) {
        auVar4 = ZEXT416((uint)(fVar14 + (float)local_a8._0_4_));
        if ((local_b8 <= fVar14 + (float)local_a8._0_4_) || (text_end <= text_begin)) break;
        pcVar7 = (char *)memchr(text_begin,10,(long)text_end - (long)text_begin);
        local_a8 = auVar4;
        if (0.0 < wrap_width) {
          pcVar7 = CalcWordWrapPositionA(this,scale,text_begin,pcVar7,wrap_width);
          text_begin = CalcWordWrapNextLineStartA(pcVar7,text_end);
          local_b8 = clip_rect->y;
        }
        else {
          text_begin = pcVar7 + 1;
          if (pcVar7 == (char *)0x0) {
            text_begin = text_end;
          }
        }
      }
    }
    pcVar7 = text_end;
    if ((wrap_width <= 0.0) && (10000 < (long)text_end - (long)text_begin)) {
      local_68 = clip_rect->w;
      pcVar7 = text_begin;
      fVar13 = (float)local_a8._0_4_;
      while ((fVar13 < local_68 && (pcVar7 < text_end))) {
        pvVar8 = memchr(pcVar7,10,(long)text_end - (long)pcVar7);
        pcVar7 = (char *)((long)pvVar8 + 1);
        if (pvVar8 == (void *)0x0) {
          pcVar7 = text_end;
        }
        fVar13 = fVar13 + fVar14;
      }
    }
    if (text_begin != pcVar7) {
      local_68 = (float)(int)(float)local_48._0_4_;
      fStack_64 = (float)(int)(float)local_48._4_4_;
      fStack_60 = (float)(int)fStack_40;
      fStack_5c = (float)(int)fStack_3c;
      iVar11 = (int)pcVar7 - (int)text_begin;
      local_6c = iVar11 * 6;
      local_70 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_6c,iVar11 * 4);
      local_80 = draw_list->_VtxWritePtr;
      local_88 = draw_list->_IdxWritePtr;
      local_90 = (ulong)draw_list->_VtxCurrentIdx;
      local_74 = col | 0xffffff;
      local_50 = (char *)0x0;
      local_bc = local_68;
LAB_001dc5bd:
      do {
        local_b8 = (float)local_a8._0_4_;
        pcVar9 = local_50;
        text = text_begin;
        fVar13 = local_bc;
        while( true ) {
          if (pcVar7 <= text) goto LAB_001dc984;
          if (wrap_width <= 0.0) goto LAB_001dc674;
          if (pcVar9 == (char *)0x0) {
            local_48._0_4_ = fVar13;
            pcVar9 = CalcWordWrapPositionA(this,scale,text,pcVar7,(local_68 - fVar13) + wrap_width);
            fVar13 = (float)local_48._0_4_;
          }
          if (text < pcVar9) break;
          local_b8 = local_b8 + fVar14;
          text = CalcWordWrapNextLineStartA(text,pcVar7);
          pcVar9 = (char *)0x0;
          fVar13 = local_68;
        }
        local_a8 = ZEXT416((uint)local_b8);
        text_begin = text;
        local_bc = fVar13;
        local_50 = pcVar9;
LAB_001dc674:
        c = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar11 = ImTextCharFromUtf8(&c,text_begin,pcVar7);
          if (c == 0) break;
          text_begin = text_begin + iVar11;
        }
        else {
          text_begin = text_begin + 1;
        }
        if (0x1f < c) {
LAB_001dc6f1:
          pIVar10 = FindGlyph(this,(ImWchar)c);
          if (pIVar10 != (ImFontGlyph *)0x0) {
            fVar13 = pIVar10->AdvanceX;
            if (((undefined1  [40])*pIVar10 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar20 = pIVar10->X0 * scale + local_bc;
              fVar2 = clip_rect->z;
              if (fVar20 <= fVar2) {
                fVar21 = pIVar10->X1 * scale + local_bc;
                fVar3 = clip_rect->x;
                if (fVar3 <= fVar21) {
                  fVar22 = pIVar10->Y0 * scale + (float)local_a8._0_4_;
                  fVar17 = pIVar10->Y1 * scale + (float)local_a8._0_4_;
                  fVar15 = pIVar10->U0;
                  fVar19 = pIVar10->V0;
                  fVar18 = pIVar10->U1;
                  fVar16 = pIVar10->V1;
                  if (cpu_fine_clip) {
                    if (fVar20 < fVar3) {
                      fVar15 = fVar15 + (fVar18 - fVar15) *
                                        (1.0 - (fVar21 - fVar3) / (fVar21 - fVar20));
                      fVar20 = fVar3;
                    }
                    fVar3 = clip_rect->y;
                    if (fVar22 < fVar3) {
                      fVar19 = fVar19 + (fVar16 - fVar19) *
                                        (1.0 - (fVar17 - fVar3) / (fVar17 - fVar22));
                      fVar22 = fVar3;
                    }
                    if (fVar2 < fVar21) {
                      fVar18 = (fVar18 - fVar15) * ((fVar2 - fVar20) / (fVar21 - fVar20)) + fVar15;
                      fVar21 = fVar2;
                    }
                    fVar2 = clip_rect->w;
                    if (fVar2 < fVar17) {
                      fVar16 = (fVar16 - fVar19) * ((fVar2 - fVar22) / (fVar17 - fVar22)) + fVar19;
                      fVar17 = fVar2;
                    }
                    if (fVar17 <= fVar22) goto LAB_001dc972;
                  }
                  uVar5 = local_74;
                  if (((undefined1  [40])*pIVar10 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar5 = col;
                  }
                  IVar12 = (ImDrawIdx)local_90;
                  *local_88 = IVar12;
                  local_88[1] = IVar12 + 1;
                  local_88[2] = IVar12 + 2;
                  local_88[3] = IVar12;
                  local_88[4] = IVar12 + 2;
                  local_88[5] = IVar12 + 3;
                  (local_80->pos).x = fVar20;
                  (local_80->pos).y = fVar22;
                  local_80->col = uVar5;
                  (local_80->uv).x = fVar15;
                  (local_80->uv).y = fVar19;
                  local_80[1].pos.x = fVar21;
                  local_80[1].pos.y = fVar22;
                  local_80[1].col = uVar5;
                  local_80[1].uv.x = fVar18;
                  local_80[1].uv.y = fVar19;
                  local_80[2].pos.x = fVar21;
                  local_80[2].pos.y = fVar17;
                  local_80[2].col = uVar5;
                  local_80[2].uv.x = fVar18;
                  local_80[2].uv.y = fVar16;
                  local_80[3].pos.x = fVar20;
                  local_80[3].pos.y = fVar17;
                  local_80[3].col = uVar5;
                  local_80[3].uv.x = fVar15;
                  local_80[3].uv.y = fVar16;
                  local_80 = local_80 + 4;
                  local_90 = (ulong)((int)local_90 + 4);
                  local_88 = local_88 + 6;
                }
              }
            }
LAB_001dc972:
            local_bc = local_bc + fVar13 * scale;
          }
          goto LAB_001dc5bd;
        }
        if (c != 10) {
          if (c != 0xd) goto LAB_001dc6f1;
          goto LAB_001dc5bd;
        }
        local_a8._0_4_ = (float)local_a8._0_4_ + fVar14;
        local_bc = local_68;
      } while ((float)local_a8._0_4_ < clip_rect->w || (float)local_a8._0_4_ == clip_rect->w);
LAB_001dc984:
      (draw_list->VtxBuffer).Size =
           (int)(((long)local_80 - (long)(draw_list->VtxBuffer).Data) / 0x14);
      iVar11 = (int)((ulong)((long)local_88 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = iVar11;
      puVar1 = &(draw_list->CmdBuffer).Data[(long)(draw_list->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar11 - (local_70 + local_6c));
      draw_list->_VtxWritePtr = local_80;
      draw_list->_IdxWritePtr = local_88;
      draw_list->_VtxCurrentIdx = (uint)local_90;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            const char* line_end = (const char*)memchr(s, '\n', text_end - s);
            if (word_wrap_enabled)
            {
                // FIXME-OPT: This is not optimal as do first do a search for \n before calling CalcWordWrapPositionA().
                // If the specs for CalcWordWrapPositionA() were reworked to optionally return on \n we could combine both.
                // However it is still better than nothing performing the fast-forward!
                s = CalcWordWrapPositionA(scale, s, line_end, wrap_width);
                s = CalcWordWrapNextLineStartA(s, text_end);
            }
            else
            {
                s = line_end ? line_end + 1 : text_end;
            }
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;
    const char* word_wrap_eol = NULL;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}